

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O0

void phmap::priv::map_slot_policy<std::__cxx11::string,std::shared_ptr<cs::name_space>>::
     transfer<std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>
                *alloc,slot_type *new_slot,slot_type *old_slot)

{
  slot_type *in_RDX;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>_>
  *in_RSI;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
  ::emplace((slot_type *)0x1d2a2c);
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
  ::
  construct<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>,std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>>
            (in_RSI,(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
                     *)&in_RDX->value,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
              *)0x1d2a3f);
  destroy<std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
            (in_RSI,in_RDX);
  return;
}

Assistant:

static void transfer(Allocator* alloc, slot_type* new_slot,
			                     slot_type* old_slot)
			{
				emplace(new_slot);
				if (kMutableKeys::value) {
					phmap::allocator_traits<Allocator>::construct(
					    *alloc, &new_slot->mutable_value, std::move(old_slot->mutable_value));
				}
				else {
					phmap::allocator_traits<Allocator>::construct(*alloc, &new_slot->value,
					        std::move(old_slot->value));
				}
				destroy(alloc, old_slot);
			}